

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

int __thiscall
helics::apps::Connector::makeTargetConnection
          (Connector *this,string_view origin,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList,
          unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *possibleConnections,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases,function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *callback)

{
  size_t sVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  iterator iVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  int iVar9;
  long lVar10;
  apps *this_00;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *aliases_00;
  size_type __rlen;
  pointer pCVar11;
  string_view sVar12;
  string_view target;
  string_view target_00;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> aliasOptions;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  interfaceAliasList;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> connectionOptions;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> local_e8;
  undefined1 local_d0 [8];
  _Rb_tree_node_base _Stack_c8;
  undefined1 local_a0 [8];
  _Rb_tree_node_base local_98;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_60;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  target._M_len = origin._M_str;
  this_00 = (apps *)origin._M_len;
  local_60 = (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              *)tagList;
  buildPossibleConnectionList(&local_58,this,origin,tagList);
  if (local_58.
      super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_58.
      super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    pCVar11 = local_58.
              super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar5 = CLI::std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&possibleConnections->_M_h,&pCVar11->interface2);
      if (iVar5.
          super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>.
          _M_cur == (__node_type *)0x0) {
        if ((aliases->_M_h)._M_element_count != 0) {
          sVar12._M_str = (char *)aliases;
          sVar12._M_len = (size_t)(pCVar11->interface2)._M_str;
          generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)local_a0,(apps *)(pCVar11->interface2)._M_len,sVar12,
                          (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           *)tagList);
          for (p_Var6 = local_98._M_left; p_Var6 != &local_98;
              p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
            sVar1 = *(size_t *)(p_Var6 + 1);
            if (((sVar1 != (pCVar11->interface2)._M_len) ||
                ((sVar1 != 0 &&
                 (iVar3 = bcmp(p_Var6[1]._M_parent,(pCVar11->interface2)._M_str,sVar1), iVar3 != 0))
                )) && (iVar5 = CLI::std::
                               _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               ::find(&possibleConnections->_M_h,(key_type *)(p_Var6 + 1)),
                      iVar5.
                      super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                      ._M_cur != (__node_type *)0x0)) {
              local_e8.
              super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                   (undefined4)(pCVar11->interface2)._M_len;
              local_e8.
              super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                   *(undefined4 *)((long)&(pCVar11->interface2)._M_len + 4);
              local_e8.
              super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
                   *(undefined4 *)&(pCVar11->interface2)._M_str;
              local_e8.
              super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                   *(undefined4 *)((long)&(pCVar11->interface2)._M_str + 4);
              if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
                local_d0 = (undefined1  [8])this_00;
                _Stack_c8._0_8_ = target._M_len;
                std::__throw_bad_function_call();
              }
              local_d0 = (undefined1  [8])this_00;
              _Stack_c8._0_8_ = target._M_len;
              (*callback->_M_invoker)
                        ((_Any_data *)callback,
                         (basic_string_view<char,_std::char_traits<char>_> *)local_d0,
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_e8);
              iVar9 = iVar9 + 1;
              if (this->matchMultiple == false) goto LAB_0029938d;
              break;
            }
          }
          std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_a0);
        }
      }
      else {
        local_d0 = (undefined1  [8])(pCVar11->interface2)._M_len;
        _Stack_c8._0_8_ = (pCVar11->interface2)._M_str;
        local_a0 = (undefined1  [8])this_00;
        local_98._0_8_ = target._M_len;
        if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*callback->_M_invoker)
                  ((_Any_data *)callback,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_a0,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_d0);
        iVar9 = iVar9 + 1;
        if (this->matchMultiple == false) goto LAB_00299397;
      }
      pCVar11 = pCVar11 + 1;
    } while (pCVar11 !=
             local_58.
             super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((aliases->_M_h)._M_element_count != 0) {
    target._M_str = (char *)aliases;
    generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)local_a0,this_00,target,
                    (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     *)tagList);
    for (p_Var8 = local_98._M_left; p_Var8 != &local_98;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      sVar12 = *(string_view *)(p_Var8 + 1);
      if ((*(apps **)(p_Var8 + 1) != this_00) ||
         ((this_00 != (apps *)0x0 &&
          (iVar3 = bcmp(p_Var8[1]._M_parent,target._M_len,(size_t)this_00), iVar3 != 0)))) {
        aliases_00 = local_60;
        buildPossibleConnectionList
                  (&local_e8,this,sVar12,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_60);
        lVar2 = CONCAT44(local_e8.
                         super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         local_e8.
                         super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_4_);
        for (lVar10 = CONCAT44(local_e8.
                               super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_e8.
                               super__Vector_base<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_); lVar10 != lVar2;
            lVar10 = lVar10 + 0x50) {
          iVar5 = CLI::std::
                  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::find(&possibleConnections->_M_h,(key_type *)(lVar10 + 0x10));
          if (iVar5.
              super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            iVar3 = iVar9;
            if ((aliases->_M_h)._M_element_count != 0) {
              target_00._M_str = (char *)aliases;
              target_00._M_len = *(size_t *)(lVar10 + 0x18);
              generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)local_d0,*(apps **)(lVar10 + 0x10),target_00,aliases_00);
              for (p_Var7 = _Stack_c8._M_left; p_Var7 != &_Stack_c8;
                  p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
                sVar1 = *(size_t *)(p_Var8 + 1);
                if (((sVar1 != *(size_t *)(lVar10 + 0x10)) ||
                    ((sVar1 != 0 &&
                     (iVar4 = bcmp(p_Var8[1]._M_parent,*(void **)(lVar10 + 0x18),sVar1), iVar4 != 0)
                     ))) && (iVar5 = CLI::std::
                                     _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                     ::find(&possibleConnections->_M_h,(key_type *)(p_Var7 + 1)),
                            iVar5.
                            super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                            ._M_cur != (__node_type *)0x0)) {
                  local_40._M_len._0_4_ = *(undefined4 *)(lVar10 + 0x10);
                  local_40._M_len._4_4_ = *(undefined4 *)(lVar10 + 0x14);
                  local_40._M_str._0_4_ = *(undefined4 *)(lVar10 + 0x18);
                  local_40._M_str._4_4_ = *(undefined4 *)(lVar10 + 0x1c);
                  local_70._M_len = (size_t)this_00;
                  local_70._M_str = target._M_len;
                  if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
                    std::__throw_bad_function_call();
                  }
                  (*callback->_M_invoker)((_Any_data *)callback,&local_70,&local_40);
                  iVar3 = iVar9 + 1;
                  if (this->matchMultiple == false) {
                    std::
                    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 *)local_d0);
                    goto LAB_00299383;
                  }
                  break;
                }
              }
              std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)local_d0);
            }
          }
          else {
            local_70._M_len = *(undefined8 *)(lVar10 + 0x10);
            local_70._M_str = *(char **)(lVar10 + 0x18);
            if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
              local_d0 = (undefined1  [8])this_00;
              _Stack_c8._0_8_ = target._M_len;
              std::__throw_bad_function_call();
            }
            local_d0 = (undefined1  [8])this_00;
            _Stack_c8._0_8_ = target._M_len;
            (*callback->_M_invoker)
                      ((_Any_data *)callback,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_d0,&local_70);
            iVar3 = iVar9 + 1;
            if (this->matchMultiple == false) {
LAB_00299383:
              iVar9 = iVar9 + 1;
              CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
              ::~vector(&local_e8);
              goto LAB_0029938d;
            }
          }
          iVar9 = iVar3;
        }
        CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
        ~vector(&local_e8);
      }
    }
LAB_0029938d:
    std::
    _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_a0);
  }
LAB_00299397:
  CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::~vector
            (&local_58);
  return iVar9;
}

Assistant:

int Connector::makeTargetConnection(
    std::string_view origin,
    const std::vector<std::size_t>& tagList,
    std::unordered_set<std::string_view>& possibleConnections,
    const std::unordered_multimap<std::string_view, std::string_view>& aliases,
    const std::function<void(std::string_view, std::string_view)>& callback)
{
    int matched{0};
    auto connectionOptions = buildPossibleConnectionList(origin, tagList);
    for (const auto& option : connectionOptions) {
        auto located = possibleConnections.find(option.interface2);
        if (located != possibleConnections.end()) {
            /* source, target*/
            callback(origin, option.interface2);
            ++matched;
            if (!matchMultiple) {
                return matched;
            }

        } else {
            if (!aliases.empty()) {
                auto aliasList = generateAliases(option.interface2, aliases);
                for (const auto& alias : aliasList) {
                    if (alias == option.interface2) {
                        continue;
                    }
                    located = possibleConnections.find(alias);
                    if (located != possibleConnections.end()) {
                        callback(origin, option.interface2);
                        ++matched;
                        if (!matchMultiple) {
                            return matched;
                        }
                        break;
                    }
                }
            }
        }
    }
    if (!aliases.empty()) {
        auto aliasList = generateAliases(origin, aliases);
        for (const auto& alias : aliasList) {
            if (alias == origin) {
                continue;
            }
            auto aliasOptions = buildPossibleConnectionList(alias, tagList);
            for (const auto& option : aliasOptions) {
                auto located = possibleConnections.find(option.interface2);
                if (located != possibleConnections.end()) {
                    /* source, target*/
                    callback(origin, option.interface2);
                    ++matched;
                    if (!matchMultiple) {
                        return matched;
                    }

                } else {
                    if (!aliases.empty()) {
                        auto interfaceAliasList = generateAliases(option.interface2, aliases);
                        for (const auto& interfaceAlias : interfaceAliasList) {
                            if (alias == option.interface2) {
                                continue;
                            }
                            located = possibleConnections.find(interfaceAlias);
                            if (located != possibleConnections.end()) {
                                callback(origin, option.interface2);
                                ++matched;
                                if (!matchMultiple) {
                                    return matched;
                                }
                                break;
                            }
                        }
                    }
                }
            }
        }
    }
    return matched;
}